

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-help.c
# Opt level: O0

_Bool show_file(char *name,char *what,int line,int mode)

{
  bool bVar1;
  _Bool _Var2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  ushort **ppuVar8;
  bool bVar9;
  keypress kVar10;
  char local_15a8 [8];
  char ftmp [80];
  char tmp [80];
  ui_event_type local_14f8;
  char *pcStack_14e0;
  int len;
  char *str;
  int local_14d0;
  _Bool skip_lines;
  int hgt;
  int wid;
  char hook [26] [32];
  char lc_buf [1024];
  char buf [1024];
  char path [1024];
  char caption [128];
  char filename [1024];
  char shower [80];
  char finder [80];
  char *tag;
  char *find;
  ang_file *fff;
  _Bool case_sensitive;
  _Bool menu;
  int back;
  int size;
  int next;
  keypress ch;
  int n;
  int k;
  int i;
  int mode_local;
  int line_local;
  char *what_local;
  char *name_local;
  
  memset(&size,0,0xc);
  back = 0;
  fff._4_4_ = 0;
  bVar1 = false;
  bVar3 = false;
  find = (char *)0x0;
  tag = (char *)0x0;
  finder[0x48] = '\0';
  finder[0x49] = '\0';
  finder[0x4a] = '\0';
  finder[0x4b] = '\0';
  finder[0x4c] = '\0';
  finder[0x4d] = '\0';
  finder[0x4e] = '\0';
  finder[0x4f] = '\0';
  memset(shower + 0x48,0,0x50);
  memset(filename + 0x3f8,0,0x50);
  memset(path + 0x3f8,0,0x80);
  bVar9 = false;
  for (n = 0; n < 0x1a; n = n + 1) {
    *(undefined1 *)(&hgt + (long)n * 8) = 0;
  }
  Term_get_size((int *)&stack0xffffffffffffeb34,&local_14d0);
  my_strcpy(caption + 0x78,name,0x400);
  sVar5 = strlen(caption + 0x78);
  ch.code = (keycode_t)sVar5;
  for (n = 0; n < (int)(keycode_t)sVar5; n = n + 1) {
    if (caption[(long)n + 0x78] == '#') {
      caption[(long)n + 0x78] = '\0';
      finder._72_8_ = caption + (long)n + 0x79;
      break;
    }
  }
  pcVar6 = caption + 0x78;
  if (what != (char *)0x0) {
    my_strcpy(path + 0x3f8,what,0x80);
    my_strcpy(buf + 0x3f8,pcVar6,0x400);
    find = (char *)file_open(buf + 0x3f8,MODE_READ,FTYPE_TEXT);
  }
  if (find == (char *)0x0) {
    strnfmt(path + 0x3f8,0x80,"Help file \'%s\'",pcVar6);
    path_build(buf + 0x3f8,0x400,ANGBAND_DIR_HELP,pcVar6);
    find = (char *)file_open(buf + 0x3f8,MODE_READ,FTYPE_TEXT);
  }
  i = line;
  if (find == (char *)0x0) {
    msg("Cannot open \'%s\'.",pcVar6);
    event_signal(EVENT_MESSAGE_FLUSH);
    name_local._7_1_ = true;
  }
  else {
    while (iVar4 = back, _Var2 = file_getl((ang_file *)find,lc_buf + 0x3f8,0x400), _Var2) {
      if (bVar9) {
        _Var2 = contains_only_spaces(lc_buf + 0x3f8);
        if (_Var2) {
          bVar9 = false;
        }
      }
      else {
        _Var2 = prefix(lc_buf + 0x3f8,".. ");
        if (_Var2) {
          _Var2 = prefix(lc_buf + 0x3fb,"menu:: [");
          if ((_Var2) && (buf[4] == ']')) {
            bVar1 = true;
            ch._8_4_ = buf[3] + -0x61;
            if ((-1 < (int)ch._8_4_) && ((int)ch._8_4_ < 0x1a)) {
              my_strcpy((char *)(&hgt + (long)(int)ch._8_4_ * 8),buf + 6,0x20);
            }
          }
          else if ((lc_buf[0x3fb] == '_') && (finder._72_8_ != 0)) {
            sVar5 = strlen(lc_buf + 0x3f8);
            lc_buf[sVar5 + 0x3f7] = '\0';
            iVar4 = strcmp(lc_buf + 0x3fc,(char *)finder._72_8_);
            if (iVar4 == 0) {
              i = back;
            }
          }
          bVar9 = true;
        }
        else {
          back = back + 1;
        }
      }
    }
LAB_002293d5:
    do {
      Term_clear();
      if (iVar4 - (local_14d0 + -4) < i) {
        i = iVar4 - (local_14d0 + -4);
      }
      if (i < 0) {
        i = 0;
      }
      bVar9 = false;
      if (i < back) {
        file_close((ang_file *)find);
        find = (char *)file_open(buf + 0x3f8,MODE_READ,FTYPE_TEXT);
        if ((ang_file *)find == (ang_file *)0x0) {
          return true;
        }
        back = 0;
      }
      while ((back < i && (_Var2 = file_getl((ang_file *)find,lc_buf + 0x3f8,0x400), _Var2))) {
        if (bVar9) {
          _Var2 = contains_only_spaces(lc_buf + 0x3f8);
          if (_Var2) {
            bVar9 = false;
          }
        }
        else {
          _Var2 = prefix(lc_buf + 0x3f8,".. ");
          if (_Var2) {
            bVar9 = true;
          }
          else {
            back = back + 1;
          }
        }
      }
      n = 0;
      while (n < local_14d0 + -4) {
        if (n == 0) {
          i = back;
        }
        _Var2 = file_getl((ang_file *)find,lc_buf + 0x3f8,0x400);
        if (!_Var2) break;
        if (bVar9) {
          _Var2 = contains_only_spaces(lc_buf + 0x3f8);
          if (_Var2) {
            bVar9 = false;
          }
        }
        else {
          _Var2 = prefix(lc_buf + 0x3f8,".. ");
          if (_Var2) {
            bVar9 = true;
          }
          else {
            back = back + 1;
            my_strcpy(hook[0x19] + 0x18,lc_buf + 0x3f8,0x400);
            if (!bVar3) {
              string_lower(hook[0x19] + 0x18);
            }
            if (((tag == (char *)0x0) || (n != 0)) ||
               (pcVar6 = strstr(hook[0x19] + 0x18,tag), pcVar6 != (char *)0x0)) {
              tag = (char *)0x0;
              Term_putstr(L'\0',n + L'\x02',L'\xffffffff',L'\x01',lc_buf + 0x3f8);
              sVar5 = strlen(filename + 0x3f8);
              if (sVar5 != 0) {
                pcStack_14e0 = hook[0x19] + 0x18;
                while (pcStack_14e0 = strstr(pcStack_14e0,filename + 0x3f8),
                      pcStack_14e0 != (char *)0x0) {
                  sVar5 = strlen(filename + 0x3f8);
                  Term_putstr((int)pcStack_14e0 - ((int)hook + 0x338),n + L'\x02',(wchar_t)sVar5,
                              L'\v',pcStack_14e0 + 0x400);
                  pcStack_14e0 = pcStack_14e0 + (wchar_t)sVar5;
                }
              }
              n = n + 1;
            }
          }
        }
      }
      if (tag != (char *)0x0) {
        bell();
        i = fff._4_4_;
        tag = (char *)0x0;
        goto LAB_002293d5;
      }
      pcVar6 = format("[%s, %s, Line %d-%d/%d]",buildid,path + 0x3f8,(ulong)(uint)i,
                      (ulong)((i + local_14d0) - 4),(ulong)(uint)iVar4);
      prt(pcVar6,L'\0',L'\0');
      if (bVar1) {
        prt("[Press a Letter, or ESC to exit.]",local_14d0 + L'\xffffffff',L'\0');
      }
      else if (local_14d0 + -4 < iVar4) {
        prt("[Press Space to advance, or ESC to exit.]",local_14d0 + L'\xffffffff',L'\0');
      }
      else {
        prt("[Press ESC to exit.]",local_14d0 + L'\xffffffff',L'\0');
      }
      kVar10 = inkey();
      uVar7 = kVar10._0_8_;
      local_14f8 = CONCAT31(local_14f8._1_3_,kVar10.mods);
      ch.type = local_14f8;
      next = kVar10.code;
      if (next == 0x3f) break;
      if (next == 0x21) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      bVar9 = next == 0x26;
      _size = uVar7;
      if (bVar9) {
        prt("Show: ",local_14d0 + L'\xffffffff',L'\0');
        askfor_aux(filename + 0x3f8,0x50,
                   (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (!bVar3) {
          string_lower(filename + 0x3f8);
        }
      }
      if (next == 0x2f) {
        prt("Find: ",local_14d0 + L'\xffffffff',L'\0');
        _Var2 = askfor_aux(shower + 0x48,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (_Var2) {
          tag = shower + 0x48;
          fff._4_4_ = i;
          i = i + 1;
          if (!bVar3) {
            string_lower(shower + 0x48);
          }
          my_strcpy(filename + 0x3f8,shower + 0x48,0x50);
        }
      }
      if (next == 0x23) {
        memset(ftmp + 0x48,0,0x50);
        ftmp[0x48] = '0';
        prt("Goto Line: ",local_14d0 + L'\xffffffff',L'\0');
        _Var2 = askfor_aux(ftmp + 0x48,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if (_Var2) {
          i = atoi(ftmp + 0x48);
        }
      }
      if (next == 0x25) {
        if (((player->opts).opt[1] & 1U) == 0) {
          my_strcpy(local_15a8,"index.txt",0x50);
        }
        else {
          my_strcpy(local_15a8,"r_index.txt",0x50);
        }
        prt("Goto File: ",local_14d0 + L'\xffffffff',L'\0');
        _Var2 = askfor_aux(local_15a8,0x50,
                           (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
        if ((_Var2) && (_Var2 = show_file(local_15a8,(char *)0x0,0,mode), !_Var2)) {
          _size = CONCAT44(0xe000,size);
        }
      }
      switch(next) {
      case 0x20:
      case 0x33:
      case 0x97:
        i = local_14d0 + -4 + i;
        break;
      case 0x2d:
      case 0x39:
      case 0x95:
        i = i - (local_14d0 + -4);
        break;
      case 0x31:
      case 0x96:
        i = iVar4;
        break;
      case 0x32:
      case 0x6a:
      case 0x80:
      case 0x9c:
        i = i + 1;
        break;
      case 0x37:
      case 0x94:
        i = 0;
        break;
      case 0x38:
      case 0x6b:
      case 0x83:
        i = i + -1;
      }
      if (bVar1) {
        ppuVar8 = __ctype_b_loc();
        if (((*ppuVar8)[(int)(next & 0xff)] & 0x400) != 0) {
          ch._8_4_ = next + -0x61;
          if (((-1 < (int)ch._8_4_) && ((int)ch._8_4_ < 0x1a)) &&
             (((char)(&hgt)[(long)(int)ch._8_4_ * 8] != '\0' &&
              (_Var2 = show_file((char *)(&hgt + (long)(int)ch._8_4_ * 8),(char *)0x0,0,mode),
              !_Var2)))) {
            _size = CONCAT44(0xe000,size);
          }
        }
      }
      uVar7 = _size;
    } while (next != 0xe000);
    _size = uVar7;
    file_close((ang_file *)find);
    name_local._7_1_ = next != 0x3f;
  }
  return name_local._7_1_;
}

Assistant:

bool show_file(const char *name, const char *what, int line, int mode)
{
	int i, k, n;

	struct keypress ch = KEYPRESS_NULL;

	/* Number of "real" lines passed by */
	int next = 0;

	/* Number of "real" lines in the file */
	int size;

	/* Backup value for "line" */
	int back = 0;

	/* This screen has sub-screens */
	bool menu = false;

	/* Case sensitive search */
	bool case_sensitive = false;

	/* Current help file */
	ang_file *fff = NULL;

	/* Find this string (if any) */
	char *find = NULL;

	/* Jump to this tag */
	const char *tag = NULL;

	/* Hold a string to find */
	char finder[80] = "";

	/* Hold a string to show */
	char shower[80] = "";

	/* Filename */
	char filename[1024];

	/* Describe this thing */
	char caption[128] = "";

	/* Path buffer */
	char path[1024];

	/* General buffer */
	char buf[1024];

	/* Lower case version of the buffer, for searching */
	char lc_buf[1024];

	/* Sub-menu information */
	char hook[26][32];

	int wid, hgt;
	
	/* true if we are inside a RST block that should be skipped */
	bool skip_lines = false;



	/* Wipe the hooks */
	for (i = 0; i < 26; i++) hook[i][0] = '\0';

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Copy the filename */
	my_strcpy(filename, name, sizeof(filename));

	n = strlen(filename);

	/* Extract the tag from the filename */
	for (i = 0; i < n; i++) {
		if (filename[i] == '#') {
			filename[i] = '\0';
			tag = filename + i + 1;
			break;
		}
	}

	/* Redirect the name */
	name = filename;

	/* Currently unused facility to show and describe arbitrary files */
	if (what) {
		my_strcpy(caption, what, sizeof(caption));

		my_strcpy(path, name, sizeof(path));
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Look in "help" */
	if (!fff) {
		strnfmt(caption, sizeof(caption), "Help file '%s'", name);

		path_build(path, sizeof(path), ANGBAND_DIR_HELP, name);
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Oops */
	if (!fff) {
		/* Message */
		msg("Cannot open '%s'.", name);
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Oops */
		return (true);
	}


	/* Pre-Parse the file */
	while (true) {
		/* Read a line or stop */
		if (!file_getl(fff, buf, sizeof(buf))) break;

		/* Skip lines if we are inside a RST directive */
		if (skip_lines){
			if (contains_only_spaces(buf))
				skip_lines = false;
			continue;
		}

		/* Parse a very small subset of RST */
		/* TODO: should be more flexible */
		if (prefix(buf, ".. ")) {
			/* parse ".. menu:: [x] filename.txt" (with exact spacing)*/
			if (prefix(buf+strlen(".. "), "menu:: [") && 
                           buf[strlen(".. menu:: [x")]==']') {
				/* This is a menu file */
				menu = true;

				/* Extract the menu item */
				k = A2I(buf[strlen(".. menu:: [")]);

				/* Store the menu item (if valid) */
				if ((k >= 0) && (k < 26))
					my_strcpy(hook[k], buf + strlen(".. menu:: [x] "),
							  sizeof(hook[0]));
			} else if (buf[strlen(".. ")] == '_') {
				/* parse ".. _some_hyperlink_target:" */
				if (tag) {
					/* Remove the closing '>' of the tag */
					buf[strlen(buf) - 1] = '\0';

					/* Compare with the requested tag */
					if (streq(buf + strlen(".. _"), tag)) {
						/* Remember the tagged line */
						line = next;
					}
				}
			}

			/* Skip this and enter skip mode*/
			skip_lines = true;
			continue;
		}

		/* Count the "real" lines */
		next++;
	}

	/* Save the number of "real" lines */
	size = next;


	/* Display the file */
	while (true) {
		/* Clear screen */
		Term_clear();


		/* Restrict the visible range */
		if (line > (size - (hgt - 4))) line = size - (hgt - 4);
		if (line < 0) line = 0;

		skip_lines = false;

		/* Re-open the file if needed */
		if (next > line) {
			/* Close it */
			file_close(fff);

			/* Hack -- Re-Open the file */
			fff = file_open(path, MODE_READ, FTYPE_TEXT);
			if (!fff) return (true);

			/* File has been restarted */
			next = 0;
		}


		/* Goto the selected line */
		while (next < line) {
			/* Get a line */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive*/
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines=false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the lines */
			next++;
		}


		/* Dump the next lines of the file */
		for (i = 0; i < hgt - 4; ) {
			/* Hack -- track the "first" line */
			if (!i) line = next;

			/* Get a line of the file or stop */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive */
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines = false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the "real" lines */
			next++;

			/* Make a copy of the current line for searching */
			my_strcpy(lc_buf, buf, sizeof(lc_buf));

			/* Make the line lower case */
			if (!case_sensitive) string_lower(lc_buf);

			/* Hack -- keep searching */
			if (find && !i && !strstr(lc_buf, find)) continue;

			/* Hack -- stop searching */
			find = NULL;

			/* Dump the line */
			Term_putstr(0, i+2, -1, COLOUR_WHITE, buf);

			/* Highlight "shower" */
			if (strlen(shower)) {
				const char *str = lc_buf;

				/* Display matches */
				while ((str = strstr(str, shower)) != NULL) {
					int len = strlen(shower);

					/* Display the match */
					Term_putstr(str-lc_buf, i+2, len, COLOUR_YELLOW,
								&buf[str-lc_buf]);

					/* Advance */
					str += len;
				}
			}

			/* Count the printed lines */
			i++;
		}

		/* Hack -- failed search */
		if (find) {
			bell();
			line = back;
			find = NULL;
			continue;
		}


		/* Show a general "title" */
		prt(format("[%s, %s, Line %d-%d/%d]", buildid,
		           caption, line, line + hgt - 4, size), 0, 0);


		/* Prompt */
		if (menu) {
			/* Menu screen */
			prt("[Press a Letter, or ESC to exit.]", hgt - 1, 0);
		} else if (size <= hgt - 4) {
			/* Small files */
			prt("[Press ESC to exit.]", hgt - 1, 0);
		} else {
			/* Large files */
			prt("[Press Space to advance, or ESC to exit.]", hgt - 1, 0);
		}

		/* Get a keypress */
		ch = inkey();

		/* Exit the help */
		if (ch.code == '?') break;

		/* Toggle case sensitive on/off */
		if (ch.code == '!')
			case_sensitive = !case_sensitive;

		/* Try showing */
		if (ch.code == '&') {
			/* Get "shower" */
			prt("Show: ", hgt - 1, 0);
			(void)askfor_aux(shower, sizeof(shower), NULL);

			/* Make the "shower" lowercase */
			if (!case_sensitive) string_lower(shower);
		}

		/* Try finding */
		if (ch.code == '/') {
			/* Get "finder" */
			prt("Find: ", hgt - 1, 0);
			if (askfor_aux(finder, sizeof(finder), NULL)) {
				/* Find it */
				find = finder;
				back = line;
				line = line + 1;

				/* Make the "finder" lowercase */
				if (!case_sensitive) string_lower(finder);

				/* Show it */
				my_strcpy(shower, finder, sizeof(shower));
			}
		}

		/* Go to a specific line */
		if (ch.code == '#') {
			char tmp[80] = "0";

			prt("Goto Line: ", hgt - 1, 0);
			if (askfor_aux(tmp, sizeof(tmp), NULL))
				line = atoi(tmp);
		}

		/* Go to a specific file */
		if (ch.code == '%') {
			char ftmp[80];

			if (OPT(player, rogue_like_commands)) {
				my_strcpy(ftmp, "r_index.txt", sizeof(ftmp));
			} else {
				my_strcpy(ftmp, "index.txt", sizeof(ftmp));
			}

			prt("Goto File: ", hgt - 1, 0);
			if (askfor_aux(ftmp, sizeof(ftmp), NULL)) {
				if (!show_file(ftmp, NULL, 0, mode))
					ch.code = ESCAPE;
			}
		}

		switch (ch.code) {
			/* up a line */
			case ARROW_UP:
			case 'k':
			case '8': line--; break;

			/* up a page */
			case KC_PGUP:
			case '9':
			case '-': line -= (hgt - 4); break;

			/* home */
			case KC_HOME:
			case '7': line = 0; break;

			/* down a line */
			case ARROW_DOWN:
			case '2':
			case 'j':
			case KC_ENTER: line++; break;

			/* down a page */
			case KC_PGDOWN:
			case '3':
			case ' ': line += hgt - 4; break;

			/* end */
			case KC_END:
			case '1': line = size; break;
		}

		/* Recurse on letters */
		if (menu && isalpha((unsigned char)ch.code)) {
			/* Extract the requested menu item */
			k = A2I(ch.code);

			/* Verify the menu item */
			if ((k >= 0) && (k <= 25) && hook[k][0]) {
				/* Recurse on that file */
				if (!show_file(hook[k], NULL, 0, mode)) ch.code = ESCAPE;
			}
		}

		/* Exit on escape */
		if (ch.code == ESCAPE) break;
	}

	/* Close the file */
	file_close(fff);

	/* Done */
	return (ch.code != '?');
}